

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::UninterpretedOption::Clear(UninterpretedOption *this)

{
  uint uVar1;
  long in_RDI;
  uint32 cached_has_bits;
  
  RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart>::Clear
            ((RepeatedPtrField<google::protobuf::UninterpretedOption_NamePart> *)0x5349a4);
  uVar1 = *(uint *)(in_RDI + 0x10);
  if ((uVar1 & 7) != 0) {
    if ((uVar1 & 1) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x5349f1);
    }
    if ((uVar1 & 2) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x534a0b);
    }
    if ((uVar1 & 4) != 0) {
      internal::ArenaStringPtr::ClearNonDefaultToEmpty((ArenaStringPtr *)0x534a25);
    }
  }
  if ((uVar1 & 0x38) != 0) {
    memset((void *)(in_RDI + 0x48),0,0x18);
  }
  memset((void *)(in_RDI + 0x10),0,4);
  if (((uint)(((InternalMetadataWithArena *)(in_RDI + 8))->
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             ).ptr_ & 1) == 1) {
    internal::InternalMetadataWithArena::DoClear((InternalMetadataWithArena *)(in_RDI + 8));
  }
  return;
}

Assistant:

void UninterpretedOption::Clear() {
// @@protoc_insertion_point(message_clear_start:google.protobuf.UninterpretedOption)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  name_.Clear();
  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x00000007u) {
    if (cached_has_bits & 0x00000001u) {
      identifier_value_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000002u) {
      string_value_.ClearNonDefaultToEmpty();
    }
    if (cached_has_bits & 0x00000004u) {
      aggregate_value_.ClearNonDefaultToEmpty();
    }
  }
  if (cached_has_bits & 0x00000038u) {
    ::memset(&positive_int_value_, 0, static_cast<size_t>(
        reinterpret_cast<char*>(&double_value_) -
        reinterpret_cast<char*>(&positive_int_value_)) + sizeof(double_value_));
  }
  _has_bits_.Clear();
  _internal_metadata_.Clear();
}